

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRGraphicsWindowNode.cpp
# Opt level: O3

void __thiscall MinVR::VRGraphicsWindowNode::~VRGraphicsWindowNode(VRGraphicsWindowNode *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_VRDisplayNode)._vptr_VRDisplayNode =
       (_func_int **)&PTR__VRGraphicsWindowNode_00177610;
  pcVar2 = (this->_settings).caption._M_dataplus._M_p;
  paVar1 = &(this->_settings).caption.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  VRDisplayNode::~VRDisplayNode(&this->super_VRDisplayNode);
  return;
}

Assistant:

VRGraphicsWindowNode::~VRGraphicsWindowNode() {
}